

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

bool semver::detail::cmp_less<int,unsigned_long>(int t,unsigned_long u)

{
  bool local_19;
  unsigned_long u_local;
  int t_local;
  
  local_19 = t < 0 || (uint)t < u;
  return local_19;
}

Assistant:

SEMVER_CONSTEXPR bool cmp_less(T t, U u) noexcept
{
  if constexpr (std::is_signed_v<T> == std::is_signed_v<U>)
    return t < u;
  else if constexpr (std::is_signed_v<T>)
    return t < 0 || std::make_unsigned_t<T>(t) < u;
  else
    return u >= 0 && t < std::make_unsigned_t<U>(u);
}